

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::SpreadVolatileSemantics::SpreadVolatileSemanticsToVariables
          (SpreadVolatileSemantics *this,bool is_vk_memory_model_enabled)

{
  Module *pMVar1;
  Instruction *this_00;
  uint32_t var_id;
  Status SVar2;
  Instruction *var;
  Instruction **ppIVar3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_function_ids;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  SVar2 = SuccessWithoutChange;
  ppIVar3 = (Instruction **)
            ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (this_00 = *ppIVar3,
        this_00 !=
        (Instruction *)
        ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    var_id = Instruction::result_id(this_00);
    EntryFunctionsToSpreadVolatileSemanticsForVar(&entry_function_ids,this,var_id);
    if (entry_function_ids._M_h._M_element_count != 0) {
      if (is_vk_memory_model_enabled) {
        SetVolatileForLoadsInEntries(this,this_00,&entry_function_ids);
      }
      else {
        DecorateVarWithVolatile(this,this_00);
      }
      SVar2 = SuccessWithChange;
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&entry_function_ids._M_h);
    ppIVar3 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return SVar2;
}

Assistant:

Pass::Status SpreadVolatileSemantics::SpreadVolatileSemanticsToVariables(
    const bool is_vk_memory_model_enabled) {
  Status status = Status::SuccessWithoutChange;
  for (Instruction& var : context()->types_values()) {
    auto entry_function_ids =
        EntryFunctionsToSpreadVolatileSemanticsForVar(var.result_id());
    if (entry_function_ids.empty()) {
      continue;
    }

    if (is_vk_memory_model_enabled) {
      SetVolatileForLoadsInEntries(&var, entry_function_ids);
    } else {
      DecorateVarWithVolatile(&var);
    }
    status = Status::SuccessWithChange;
  }
  return status;
}